

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O2

void uWS::WebSocketHandshake::Sha1Loop<3>::f<7>(uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = b[3] ^ b[8] ^ b[0xd] ^ b[0xb];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[0xb] = uVar2;
  uVar1 = *a;
  a[2] = a[2] + (a[1] << 5 | a[1] >> 0x1b) + (a[4] ^ a[3] ^ uVar1) + uVar2 + 0x6ed9eba1;
  *a = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

static inline uint32_t rol(uint32_t value, size_t bits) {return (value << bits) | (value >> (32 - bits));}